

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v2.cc
# Opt level: O3

int lf::io::DimOf(ElementType et)

{
  int iVar1;
  runtime_error *this;
  stringstream ss;
  string local_200;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  switch(et) {
  case EDGE2:
  case EDGE3:
  case EDGE4:
  case EDGE5:
  case EDGE6:
    iVar1 = 1;
    break;
  case TRIA3:
  case QUAD4:
  case TRIA6:
  case QUAD9:
  case QUAD8:
  case TRIA9:
  case TRIA10:
  case TRIA12:
  case TRIA15:
  case TRIA15_5:
  case TRIA21:
    iVar1 = 2;
    break;
  case POINT:
    iVar1 = 0;
    break;
  default:
    if (1 < et - HEX64) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>(local_190,"Unknown GmshElement Type.",0x19)
      ;
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"false","");
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_200,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/gmsh_file_v2.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_1e0,&local_200,0x161,&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"this code should not be reached");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  case TET4:
  case HEX8:
  case PRISM6:
  case PYRAMID5:
  case TET10:
  case HEX27:
  case PRISM18:
  case PYRAMID14:
  case HEX20:
  case PRISM15:
  case PYRAMID13:
  case TET20:
  case TET35:
  case TET56:
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

int DimOf(GMshFileV2::ElementType et) {
  switch (et) {
    case GMshFileV2::ElementType::POINT:
      return 0;
    case GMshFileV2::ElementType::EDGE2:
    case GMshFileV2::ElementType::EDGE3:
    case GMshFileV2::ElementType::EDGE4:
    case GMshFileV2::ElementType::EDGE5:
    case GMshFileV2::ElementType::EDGE6:
      return 1;
    case GMshFileV2::ElementType::TRIA3:
    case GMshFileV2::ElementType::QUAD4:
    case GMshFileV2::ElementType::TRIA6:
    case GMshFileV2::ElementType::QUAD9:
    case GMshFileV2::ElementType::QUAD8:
    case GMshFileV2::ElementType::TRIA9:
    case GMshFileV2::ElementType::TRIA10:
    case GMshFileV2::ElementType::TRIA12:
    case GMshFileV2::ElementType::TRIA15:
    case GMshFileV2::ElementType::TRIA15_5:
    case GMshFileV2::ElementType::TRIA21:
      return 2;
    case GMshFileV2::ElementType::TET4:
    case GMshFileV2::ElementType::HEX8:
    case GMshFileV2::ElementType::PRISM6:
    case GMshFileV2::ElementType::PYRAMID5:
    case GMshFileV2::ElementType::TET10:
    case GMshFileV2::ElementType::HEX27:
    case GMshFileV2::ElementType::PRISM18:
    case GMshFileV2::ElementType::PYRAMID14:
    case GMshFileV2::ElementType::HEX20:
    case GMshFileV2::ElementType::PRISM15:
    case GMshFileV2::ElementType::PYRAMID13:
    case GMshFileV2::ElementType::TET20:
    case GMshFileV2::ElementType::TET35:
    case GMshFileV2::ElementType::TET56:
    case GMshFileV2::ElementType::HEX64:
    case GMshFileV2::ElementType::HEX125:
      return 3;
    default:
      LF_VERIFY_MSG(false, "Unknown GmshElement Type.");
  }
  // Make compiler happy:
  return -1;
}